

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

Lit __thiscall Minisat::Clause::subsumes(Clause *this,Clause *other)

{
  anon_struct_4_5_613047fb_for_header aVar1;
  long lVar2;
  anon_struct_4_5_613047fb_for_header aVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  uint i;
  ulong uVar7;
  uint j;
  ulong uVar8;
  anon_struct_4_5_613047fb_for_header aVar9;
  
  aVar3 = this->header;
  if (((uint)aVar3 & 4) == 0) {
    aVar1 = other->header;
    if (((uint)aVar1 & 4) == 0) {
      if (((uint)aVar3 & 8) == 0) {
        pcVar6 = "header.has_extra";
      }
      else {
        if (((uint)aVar1 & 8) != 0) {
          uVar5 = (uint)aVar1 >> 5;
          uVar4 = (uint)aVar3 >> 5;
          aVar3 = (anon_struct_4_5_613047fb_for_header)0xffffffff;
          if ((uVar4 <= uVar5) &&
             (((uint)this[(ulong)uVar4 + 1].header & ~(uint)other[(ulong)uVar5 + 1].header) == 0)) {
            aVar3 = (anon_struct_4_5_613047fb_for_header)0xfffffffe;
            for (uVar7 = 0; uVar7 != uVar4; uVar7 = uVar7 + 1) {
              uVar8 = 0;
              do {
                if (uVar5 == uVar8) {
                  return (Lit)-1;
                }
                lVar2 = uVar8 + 1;
                aVar1 = this[uVar7 + 1].header;
                aVar9 = aVar3;
              } while ((aVar1 != other[lVar2].header) &&
                      ((uVar8 = uVar8 + 1, aVar3 != (anon_struct_4_5_613047fb_for_header)0xfffffffe
                       || (aVar9 = aVar1, ((uint)other[lVar2].header ^ (uint)aVar1) != 1))));
              aVar3 = aVar9;
            }
          }
          return (Lit)(int)aVar3;
        }
        pcVar6 = "other.header.has_extra";
      }
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/SolverTypes.h"
                    ,0x1bb,"Lit Minisat::Clause::subsumes(const Clause &) const");
    }
    pcVar6 = "!other.header.learnt";
  }
  else {
    pcVar6 = "!header.learnt";
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/SolverTypes.h"
                ,0x1ba,"Lit Minisat::Clause::subsumes(const Clause &) const");
}

Assistant:

inline Lit Clause::subsumes(const Clause& other) const
{
    //if (other.size() < size() || (extra.abst & ~other.extra.abst) != 0)
    //if (other.size() < size() || (!learnt() && !other.learnt() && (extra.abst & ~other.extra.abst) != 0))
    assert(!header.learnt);   assert(!other.header.learnt);
    assert(header.has_extra); assert(other.header.has_extra);
    if (other.header.size < header.size || (data[header.size].abs & ~other.data[other.header.size].abs) != 0)
        return lit_Error;

    Lit        ret = lit_Undef;
    const Lit* c   = (const Lit*)(*this);
    const Lit* d   = (const Lit*)other;

    for (unsigned i = 0; i < header.size; i++) {
        // search for c[i] or ~c[i]
        for (unsigned j = 0; j < other.header.size; j++)
            if (c[i] == d[j])
                goto ok;
            else if (ret == lit_Undef && c[i] == ~d[j]){
                ret = c[i];
                goto ok;
            }

        // did not find it
        return lit_Error;
    ok:;
    }

    return ret;
}